

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::loadArguments(Executor *this,int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  runtime_error *prVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  Values initial;
  allocator_type local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ulong local_68;
  Executor *local_60;
  char **local_58;
  ulong local_50;
  Values local_48;
  
  if (0x55555554 < argc * -0x55555555 + 0x7fffffffU) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Wrong arguments.",0x10);
    return;
  }
  uVar6 = (argc + -1) / 3;
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar10 = (ulong)uVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,uVar10,&local_89);
  puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar6 = argc + 1;
  local_68 = (ulong)uVar6;
  uVar8 = 1;
  if (4 < uVar6) {
    puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar11 = 1;
    if (1 < uVar4) {
      uVar11 = (ulong)uVar4;
    }
    uVar9 = 1;
    do {
      uVar3 = atoi(argv[uVar9]);
      uVar6 = -uVar3;
      if (0 < (int)uVar3) {
        uVar6 = uVar3;
      }
      puVar1[uVar9 - 1] = uVar6;
      uVar8 = uVar9 + 1;
      bVar12 = uVar9 != uVar11;
      uVar9 = uVar8;
    } while (bVar12);
    uVar6 = (uint)local_68;
  }
  iVar7 = (int)uVar8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,uVar10,&local_89);
  puVar1 = (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_60 = this;
  local_58 = argv;
  if (4 < uVar6) {
    puVar1 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = 1;
    if (1 < uVar4) {
      uVar8 = (ulong)uVar4;
    }
    uVar11 = 0;
    local_50 = uVar10;
    do {
      uVar4 = atoi(local_58[(uint)(iVar7 + (int)uVar11)]);
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      puVar2[uVar11] = uVar6;
      if (puVar1[uVar11] < uVar6) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Desired value is bigger than units size.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    iVar7 = iVar7 + (int)uVar11;
    uVar6 = (uint)local_68;
    uVar10 = local_50;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,uVar10,&local_89);
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (4 < uVar6) {
    puVar1 = (local_60->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = 1;
    if (1 < (uint)uVar10) {
      uVar8 = uVar10 & 0xffffffff;
    }
    uVar10 = 0;
    do {
      uVar4 = atoi(local_58[(uint)(iVar7 + (int)uVar10)]);
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = uVar6;
      if (puVar1[uVar10] < uVar6) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Initial value is bigger than units size.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  execute(local_60,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Executor::loadArguments(int argc, char *argv[])
{
    if ((argc - 1) % 3 != 0)
    {
        std::cout << "Wrong arguments.";
        return;
    }

    unsigned int numberOfUnits = std::abs((argc - 1 ) / 3);

    unsigned int it = 1;

    m_sizes = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_sizes[i] = std::abs(std::atoi(argv[it]));
        ++it;
    }

    m_desired = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        m_desired[i] = std::abs(std::atoi(argv[it]));
        if (m_desired[i] > m_sizes[i])
            throw std::runtime_error("Desired value is bigger than units size.");
        ++it;
    }

    Values initial(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        initial[i] = std::abs(std::atoi(argv[it]));
        if (initial[i] > m_sizes[i])
            throw std::runtime_error("Initial value is bigger than units size.");
        ++it;
    }

    execute(std::move(initial));
}